

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.h
# Opt level: O0

SerializedModel * __thiscall CoreML::Specification::Model::mutable_serializedmodel(Model *this)

{
  bool bVar1;
  SerializedModel *this_00;
  Model *this_local;
  
  bVar1 = has_serializedmodel(this);
  if (!bVar1) {
    clear_Type(this);
    set_has_serializedmodel(this);
    this_00 = (SerializedModel *)operator_new(0x28);
    SerializedModel::SerializedModel(this_00);
    (this->Type_).serializedmodel_ = this_00;
  }
  return (SerializedModel *)(this->Type_).pipelineclassifier_;
}

Assistant:

inline ::CoreML::Specification::SerializedModel* Model::mutable_serializedmodel() {
  if (!has_serializedmodel()) {
    clear_Type();
    set_has_serializedmodel();
    Type_.serializedmodel_ = new ::CoreML::Specification::SerializedModel;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Model.serializedModel)
  return Type_.serializedmodel_;
}